

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::JavaPackageToDir(string *package_name)

{
  ulong uVar1;
  string *in_RDI;
  string *package_dir;
  string *newsub;
  string *oldsub;
  string *in_stack_ffffffffffffff88;
  string local_70 [55];
  undefined1 local_39 [40];
  undefined1 local_11;
  
  local_11 = 0;
  oldsub = (string *)local_39;
  newsub = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),".",(allocator *)oldsub);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"/",(allocator *)&stack0xffffffffffffff8f);
  StringReplace(in_stack_ffffffffffffff88,oldsub,newsub,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"/");
  }
  return newsub;
}

Assistant:

std::string JavaPackageToDir(std::string package_name) {
  std::string package_dir = StringReplace(package_name, ".", "/", true);
  if (!package_dir.empty()) package_dir += "/";
  return package_dir;
}